

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int set_nice_for_calling_thread(int priority)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  pid_t pid;
  int nice;
  int r;
  int priority_local;
  
  if ((priority < -2) || (2 < priority)) {
    r = -0x16;
  }
  else {
    lVar2 = syscall(0xba);
    iVar1 = setpriority(PRIO_PROCESS,(id_t)lVar2,priority * -2);
    if (iVar1 == 0) {
      r = 0;
    }
    else {
      piVar3 = __errno_location();
      r = -*piVar3;
    }
  }
  return r;
}

Assistant:

static int set_nice_for_calling_thread(int priority) {
  int r;
  int nice;

  if (priority < UV_THREAD_PRIORITY_LOWEST || priority > UV_THREAD_PRIORITY_HIGHEST)
    return UV_EINVAL;

  pid_t pid = gettid();
  nice = 0 - priority * 2;
  r = setpriority(PRIO_PROCESS, pid, nice);
  if (r != 0)
    return UV__ERR(errno);
  return 0;
}